

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::UnaryFunctionLayerParams::ByteSizeLong(UnaryFunctionLayerParams *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->type_;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else if ((int)uVar1 < 0) {
    uVar3 = 0xb;
  }
  else {
    iVar2 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar3 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
  }
  uVar4 = uVar3;
  if (this->alpha_ != 0.0) {
    uVar4 = uVar3 + 5;
  }
  if (NAN(this->alpha_)) {
    uVar4 = uVar3 + 5;
  }
  uVar3 = uVar4;
  if (this->epsilon_ != 0.0) {
    uVar3 = uVar4 + 5;
  }
  if (NAN(this->epsilon_)) {
    uVar3 = uVar4 + 5;
  }
  uVar4 = uVar3;
  if (this->shift_ != 0.0) {
    uVar4 = uVar3 + 5;
  }
  if (NAN(this->shift_)) {
    uVar4 = uVar3 + 5;
  }
  uVar3 = uVar4;
  if (this->scale_ != 0.0) {
    uVar3 = uVar4 + 5;
  }
  if (NAN(this->scale_)) {
    uVar3 = uVar4 + 5;
  }
  this->_cached_size_ = (int)uVar3;
  return uVar3;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams_Operation UnaryFunctionLayerParams::type() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.UnaryFunctionLayerParams.type)
  return static_cast< ::CoreML::Specification::UnaryFunctionLayerParams_Operation >(type_);
}